

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_update.c
# Opt level: O0

lu_int __thiscall lu_update(lu *this,double xtbl)

{
  lu_int j_00;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  lu_int lVar5;
  int iVar6;
  int iVar7;
  long in_RDI;
  bool bVar8;
  double in_XMM0_Qa;
  lu_int *marked_00;
  lu_int *pstack_00;
  double dVar9;
  double dVar10;
  double max_eta;
  lu_int nswap;
  lu_int *pstack;
  lu_int rtop;
  lu_int *reach;
  lu_int top;
  lu_int *path;
  double piverr;
  double newpiv;
  double spike_diag;
  lu_int *row_reach;
  lu_int *col_reach;
  lu_int nreach;
  lu_int nz_spike;
  lu_int nz_roweta;
  lu_int istriangular;
  lu_int intersect;
  lu_int have_diag;
  lu_int M;
  lu_int need;
  lu_int used;
  lu_int grow;
  lu_int room;
  lu_int where;
  lu_int end;
  lu_int pos;
  lu_int put;
  lu_int t;
  lu_int nz;
  lu_int n;
  lu_int jnext;
  lu_int j;
  lu_int i;
  lu_int status;
  double oldpiv;
  lu_int ipivot;
  lu_int jpivot;
  double *work1;
  lu_int *iwork2;
  lu_int *iwork1;
  lu_int *marked;
  double *Wvalue;
  lu_int *Windex;
  double *Uvalue;
  lu_int *Uindex;
  double *Lvalue;
  lu_int *Lindex;
  double *row_pivot;
  double *col_pivot;
  lu_int *Wblink;
  lu_int *Wflink;
  lu_int *Wend;
  lu_int *Wbegin;
  lu_int *Rbegin;
  lu_int *Ubegin;
  lu_int *pivotrow;
  lu_int *pivotcol;
  lu_int *qmap;
  lu_int *pmap;
  double stretch;
  lu_int pad;
  lu_int Unz;
  lu_int nforrest;
  lu_int m;
  undefined7 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe57;
  lu_int *in_stack_fffffffffffffe58;
  double dVar11;
  undefined4 in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe64;
  lu_int *in_stack_fffffffffffffe68;
  lu_int *index;
  lu_int in_stack_fffffffffffffe70;
  lu_int in_stack_fffffffffffffe74;
  lu_int *begin;
  lu_int in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  double *in_stack_fffffffffffffe88;
  lu_int *plVar12;
  lu_int *plVar13;
  int *local_158;
  lu_int *local_150;
  int local_148;
  int local_138;
  lu_int in_stack_fffffffffffffed4;
  undefined4 in_stack_fffffffffffffed8;
  lu_int in_stack_fffffffffffffee4;
  int local_118;
  int local_114;
  int local_110;
  int local_10c;
  int local_108;
  int local_104;
  int local_e8;
  lu_int local_e4;
  lu_int *local_e0;
  lu_int *local_d8;
  lu_int *local_d0;
  lu_int *local_c8;
  double *local_c0;
  lu_int *local_b8;
  double *local_b0;
  lu_int *local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  undefined8 local_80;
  lu_int *local_78;
  lu_int *local_70;
  lu_int *local_68;
  long local_60;
  lu_int *local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  double local_30;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  long local_10;
  lu_int local_4;
  
  local_1c = *(int *)(in_RDI + 0x54);
  local_20 = *(int *)(in_RDI + 0x68);
  local_24 = *(int *)(in_RDI + 0x80);
  local_28 = *(int *)(in_RDI + 0x30);
  local_30 = *(double *)(in_RDI + 0x38);
  local_38 = *(long *)(in_RDI + 0x260);
  local_40 = *(long *)(in_RDI + 0x270);
  local_48 = *(long *)(in_RDI + 0x1d8);
  local_50 = *(long *)(in_RDI + 0x1e8);
  local_58 = *(lu_int **)(in_RDI + 0x280);
  local_60 = *(long *)(in_RDI + 0x1f8);
  local_68 = *(lu_int **)(in_RDI + 0x218);
  local_70 = *(lu_int **)(in_RDI + 0x228);
  local_78 = *(lu_int **)(in_RDI + 0x238);
  local_80 = *(undefined8 *)(in_RDI + 0x248);
  local_88 = *(long *)(in_RDI + 0x2a8);
  local_90 = *(long *)(in_RDI + 0x2b0);
  local_98 = *(long *)(in_RDI + 0x1a0);
  local_a0 = *(long *)(in_RDI + 0x1b8);
  local_a8 = *(lu_int **)(in_RDI + 0x1a8);
  local_b0 = *(double **)(in_RDI + 0x1c0);
  local_b8 = *(lu_int **)(in_RDI + 0x1b0);
  local_c0 = *(double **)(in_RDI + 0x1c8);
  local_c8 = *(lu_int **)(in_RDI + 0x290);
  local_d0 = *(lu_int **)(in_RDI + 0x210);
  local_d8 = local_d0 + local_1c;
  local_e0 = *(lu_int **)(in_RDI + 0x2a0);
  local_e4 = *(int *)(in_RDI + 0x188);
  local_e8 = *(int *)(local_38 + (long)local_e4 * 4);
  dVar11 = *(double *)(local_88 + (long)local_e4 * 8);
  plVar13 = (lu_int *)0x0;
  bVar8 = false;
  local_114 = local_58[local_1c];
  local_110 = local_114;
  for (; iVar2 = local_a8[local_114], -1 < iVar2; local_114 = local_114 + 1) {
    if (iVar2 == local_e8) {
      plVar13 = (lu_int *)local_b0[local_114];
      bVar8 = true;
    }
    else {
      local_a8[local_110] = iVar2;
      local_b0[local_110] = local_b0[local_114];
      local_110 = local_110 + 1;
    }
  }
  if (bVar8) {
    local_a8[local_110] = local_e8;
    local_b0[local_110] = (double)plVar13;
  }
  local_110 = local_110 - local_58[local_1c];
  iVar2 = *(int *)(local_60 + (long)(local_20 + 1) * 4) - *(int *)(local_60 + (long)local_20 * 4);
  iVar3 = *(int *)(in_RDI + 0x18c) + 1;
  *(int *)(in_RDI + 0x18c) = iVar3;
  for (local_114 = *(int *)(local_60 + (long)local_20 * 4);
      local_114 < *(int *)(local_60 + (long)(local_20 + 1) * 4); local_114 = local_114 + 1) {
    iVar4 = *(int *)(local_98 + (long)local_114 * 4);
    local_c8[iVar4] = iVar3;
    *(undefined8 *)(local_e0 + (long)iVar4 * 2) = *(undefined8 *)(local_a0 + (long)local_114 * 8);
  }
  local_138 = 0;
  marked_00 = plVar13;
  for (local_114 = local_58[local_1c]; local_114 < local_58[local_1c] + local_110;
      local_114 = local_114 + 1) {
    if (local_c8[local_a8[local_114]] == iVar3) {
      marked_00 = (lu_int *)
                  (-local_b0[local_114] * *(double *)(local_e0 + (long)local_a8[local_114] * 2) +
                  (double)marked_00);
      local_138 = local_138 + 1;
    }
  }
  if ((((double)marked_00 == 0.0) && (!NAN((double)marked_00))) ||
     (ABS((double)marked_00) < *(double *)(in_RDI + 0x18))) {
    local_4 = -6;
  }
  else {
    pstack_00 = (lu_int *)ABS(-in_XMM0_Qa * dVar11 + (double)marked_00);
    iVar3 = 0;
    for (local_114 = local_58[local_1c]; local_114 < local_58[local_1c] + local_110;
        local_114 = local_114 + 1) {
      iVar4 = *(int *)(local_40 + (long)local_a8[local_114] * 4);
      if (local_70[iVar4] == local_68[local_78[iVar4]]) {
        iVar3 = (int)((double)((local_70[iVar4] - local_68[iVar4]) + 1 + iVar3) +
                     local_30 * (double)((local_70[iVar4] - local_68[iVar4]) + 1) + (double)local_28
                     );
      }
    }
    iVar4 = local_70[local_1c] - local_68[local_1c];
    if (iVar4 < iVar3) {
      *(int *)(in_RDI + 0x60) = iVar3 - iVar4;
      local_4 = 1;
    }
    else {
      local_108 = 0;
      local_10 = in_RDI;
      for (local_114 = local_58[local_e8]; -1 < local_a8[local_114]; local_114 = local_114 + 1) {
        iVar7 = *(int *)(local_40 + (long)local_a8[local_114] * 4);
        iVar6 = local_70[iVar7];
        local_70[iVar7] = iVar6 + -1;
        in_stack_fffffffffffffee4 = find(local_e4,local_b8,local_68[iVar7],iVar6);
        local_b8[in_stack_fffffffffffffee4] = local_b8[iVar6 + -1];
        local_c0[in_stack_fffffffffffffee4] = local_c0[iVar6 + -1];
        local_108 = local_108 + 1;
      }
      local_24 = local_24 - local_108;
      for (local_114 = local_58[local_e8]; -1 < local_a8[local_114]; local_114 = local_114 + 1) {
        local_a8[local_114] = -1;
      }
      local_58[local_e8] = local_58[local_1c];
      local_58[local_1c] = local_110 + local_58[local_1c];
      iVar7 = local_58[local_1c];
      local_58[local_1c] = iVar7 + 1;
      local_a8[iVar7] = -1;
      for (local_114 = local_58[local_e8]; -1 < local_a8[local_114]; local_114 = local_114 + 1) {
        iVar7 = *(int *)(local_40 + (long)local_a8[local_114] * 4);
        if (local_70[iVar7] == local_68[local_78[iVar7]]) {
          iVar4 = (int)(local_30 * (double)((local_70[iVar7] - local_68[iVar7]) + 1) + 1.0 +
                       (double)local_28);
          lu_file_reappend(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70,
                           in_stack_fffffffffffffe68,
                           (lu_int *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                           in_stack_fffffffffffffe58,
                           (lu_int *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                           (lu_int *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                           in_stack_fffffffffffffe88,(lu_int)pstack_00);
        }
        iVar6 = local_70[iVar7];
        local_70[iVar7] = iVar6 + 1;
        local_b8[iVar6] = local_e4;
        local_c0[iVar6] = local_b0[local_114];
      }
      local_24 = local_110 + local_24;
      *(lu_int **)(local_88 + (long)local_e4 * 8) = plVar13;
      *(lu_int **)(local_90 + (long)local_e8 * 8) = plVar13;
      local_158 = (int *)0x0;
      local_150 = (lu_int *)0x0;
      if (bVar8) {
        bVar8 = local_138 == 0;
        if (bVar8) {
          dVar11 = *(double *)(local_10 + 0x88);
          dVar9 = ABS((double)marked_00);
          dVar10 = dVar9;
          if (dVar11 <= dVar9) {
            dVar10 = dVar11;
          }
          *(ulong *)(local_10 + 0x88) =
               ~-(ulong)NAN(dVar11) & (ulong)dVar10 | -(ulong)NAN(dVar11) & (ulong)dVar9;
          dVar11 = *(double *)(local_10 + 0x90);
          dVar9 = ABS((double)marked_00);
          dVar10 = dVar9;
          if (dVar9 <= dVar11) {
            dVar10 = dVar11;
          }
          *(ulong *)(local_10 + 0x90) =
               ~-(ulong)NAN(dVar11) & (ulong)dVar10 | -(ulong)NAN(dVar11) & (ulong)dVar9;
          local_148 = iVar2 + 1;
          local_158 = local_d0;
          local_150 = local_d8;
          *local_d0 = local_e8;
          *local_d8 = local_e4;
          local_114 = *(int *)(local_60 + (long)local_20 * 4);
          for (local_104 = 1; local_104 < local_148; local_104 = local_104 + 1) {
            iVar3 = *(int *)(local_98 + (long)local_114 * 4);
            local_d0[local_104] = iVar3;
            local_d8[local_104] = *(lu_int *)(local_40 + (long)iVar3 * 4);
            local_114 = local_114 + 1;
          }
          *(int *)(local_10 + 0x78) = *(int *)(local_10 + 0x78) + 1;
        }
      }
      else {
        index = local_e0;
        begin = local_d8;
        plVar12 = local_d0;
        lVar5 = bfs_path(local_1c,local_e4,local_68,local_70,local_b8,local_d0,local_c8,local_d8);
        bVar8 = true;
        iVar6 = *(int *)(local_10 + 0x18c) + 1;
        *(int *)(local_10 + 0x18c) = iVar6;
        iVar7 = local_1c;
        for (local_10c = lVar5; local_10c < local_1c + -1 && bVar8; local_10c = local_10c + 1) {
          iVar1 = plVar12[local_10c];
          j_00 = plVar12[local_10c + 1];
          in_stack_fffffffffffffee4 = find(j_00,local_b8,local_68[iVar1],local_70[iVar1]);
          local_b8[in_stack_fffffffffffffee4] = iVar1;
          iVar7 = lu_dfs(in_stack_fffffffffffffe80,begin,
                         (lu_int *)CONCAT44(iVar7,in_stack_fffffffffffffe70),index,
                         in_stack_fffffffffffffe64,in_stack_fffffffffffffe58,pstack_00,marked_00,
                         (lu_int)plVar13);
          begin[iVar7] = j_00;
          local_b8[in_stack_fffffffffffffee4] = j_00;
          bVar8 = local_c8[j_00] != iVar6;
        }
        if (bVar8) {
          iVar1 = plVar12[local_1c + -1];
          iVar7 = lu_dfs(in_stack_fffffffffffffe80,begin,
                         (lu_int *)CONCAT44(iVar7,in_stack_fffffffffffffe70),index,
                         in_stack_fffffffffffffe64,in_stack_fffffffffffffe58,pstack_00,marked_00,
                         (lu_int)plVar13);
          begin[iVar7] = local_e4;
          local_c8[iVar1] = local_c8[iVar1] + -1;
          for (local_114 = local_58[local_e8]; -1 < local_a8[local_114]; local_114 = local_114 + 1)
          {
            if (local_c8[*(int *)(local_40 + (long)local_a8[local_114] * 4)] == iVar6) {
              bVar8 = false;
            }
          }
          local_c8[iVar1] = local_c8[iVar1] + 1;
        }
        if (bVar8) {
          in_stack_fffffffffffffe64 = (local_1c - lVar5) + -1;
          permute((lu *)CONCAT44(in_stack_fffffffffffffee4,iVar4),
                  (lu_int *)CONCAT44(iVar3,in_stack_fffffffffffffed8),in_stack_fffffffffffffed4);
          local_24 = local_24 + -1;
          local_150 = begin + iVar7;
          local_158 = local_d0 + iVar7;
          local_148 = local_1c - iVar7;
          for (local_104 = 0; local_104 < local_148; local_104 = local_104 + 1) {
            local_158[local_104] = *(int *)(local_38 + (long)local_150[local_104] * 4);
          }
        }
      }
      if (!bVar8) {
        for (local_114 = local_68[local_e4]; local_114 < local_70[local_e4];
            local_114 = local_114 + 1) {
          iVar3 = -1;
          for (local_118 = local_58[*(int *)(local_38 + (long)local_b8[local_114] * 4)];
              -1 < local_a8[local_118]; local_118 = local_118 + 1) {
            if (local_a8[local_118] == local_e8) {
              iVar3 = local_118;
            }
          }
          local_a8[iVar3] = local_a8[local_118 + -1];
          local_b0[iVar3] = local_b0[local_118 + -1];
          local_a8[local_118 + -1] = -1;
          local_24 = local_24 + -1;
        }
        local_70[local_e4] = local_68[local_e4];
        *(lu_int **)(local_88 + (long)local_e4 * 8) = marked_00;
        *(lu_int **)(local_90 + (long)local_e8 * 8) = marked_00;
        dVar11 = *(double *)(local_10 + 0x88);
        dVar9 = ABS((double)marked_00);
        dVar10 = dVar9;
        if (dVar11 <= dVar9) {
          dVar10 = dVar11;
        }
        *(ulong *)(local_10 + 0x88) =
             ~-(ulong)NAN(dVar11) & (ulong)dVar10 | -(ulong)NAN(dVar11) & (ulong)dVar9;
        dVar11 = *(double *)(local_10 + 0x90);
        dVar9 = ABS((double)marked_00);
        dVar10 = dVar9;
        if (dVar9 <= dVar11) {
          dVar10 = dVar11;
        }
        *(ulong *)(local_10 + 0x90) =
             ~-(ulong)NAN(dVar11) & (ulong)dVar10 | -(ulong)NAN(dVar11) & (ulong)dVar9;
        local_108 = 0;
        dVar11 = 0.0;
        local_114 = *(int *)(local_60 + (long)local_20 * 4);
        local_110 = local_114;
        for (; local_114 < *(int *)(local_60 + (long)(local_20 + 1) * 4); local_114 = local_114 + 1)
        {
          dVar10 = *(double *)(local_a0 + (long)local_114 * 8);
          if ((dVar10 != 0.0) || (NAN(dVar10))) {
            dVar9 = ABS(*(double *)(local_a0 + (long)local_114 * 8));
            dVar10 = dVar9;
            if (dVar9 <= dVar11) {
              dVar10 = dVar11;
            }
            dVar11 = (double)(~-(ulong)NAN(dVar11) & (ulong)dVar10 |
                             -(ulong)NAN(dVar11) & (ulong)dVar9);
            *(undefined4 *)(local_98 + (long)local_110 * 4) =
                 *(undefined4 *)(local_98 + (long)local_114 * 4);
            *(undefined8 *)(local_a0 + (long)local_110 * 8) =
                 *(undefined8 *)(local_a0 + (long)local_114 * 8);
            local_108 = local_108 + 1;
            local_110 = local_110 + 1;
          }
        }
        *(int *)(local_60 + (long)(local_20 + 1) * 4) = local_110;
        *(int *)(local_10 + 0x84) = local_108 + *(int *)(local_10 + 0x84);
        dVar10 = *(double *)(local_10 + 0x98);
        dVar9 = dVar11;
        if (dVar11 <= dVar10) {
          dVar9 = dVar10;
        }
        *(ulong *)(local_10 + 0x98) =
             ~-(ulong)NAN(dVar10) & (ulong)dVar9 | -(ulong)NAN(dVar10) & (ulong)dVar11;
        local_148 = 1;
        local_158 = &local_e8;
        local_150 = &local_e4;
        *(int *)(local_10 + 0x68) = *(int *)(local_10 + 0x68) + 1;
        *(int *)(local_10 + 0x74) = *(int *)(local_10 + 0x74) + 1;
      }
      iVar3 = *(int *)(local_10 + 400) + local_148;
      if (iVar3 != local_1c * 2 && SBORROW4(iVar3,local_1c * 2) == iVar3 + local_1c * -2 < 0) {
        lu_garbage_perm((lu *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
      }
      local_110 = *(int *)(local_10 + 400);
      for (local_104 = 0; local_104 < local_148; local_104 = local_104 + 1) {
        *(int *)(local_50 + (long)local_110 * 4) = local_158[local_104];
        local_110 = local_110 + 1;
      }
      local_110 = *(int *)(local_10 + 400);
      for (local_104 = 0; local_104 < local_148; local_104 = local_104 + 1) {
        *(lu_int *)(local_48 + (long)local_110 * 4) = local_150[local_104];
        local_110 = local_110 + 1;
      }
      *(int *)(local_10 + 400) = local_148 + *(int *)(local_10 + 400);
      if (*(double *)(local_10 + 0x40) * (double)local_58[local_1c] <
          (double)((local_58[local_1c] - local_24) - local_1c)) {
        compress_packed(local_1c,local_58,local_a8,local_b0);
      }
      if (*(double *)(local_10 + 0x40) * (double)local_68[local_1c] <
          (double)(local_68[local_1c] -
                  (int)(local_30 * (double)local_24 + (double)local_24 +
                       (double)(local_1c * local_28)))) {
        lu_file_compress(local_1c,local_68,local_70,local_78,local_b8,local_c0,local_30,local_28);
      }
      *(double *)(local_10 + 0x170) = (double)pstack_00 / (ABS((double)marked_00) + 1.0);
      *(int *)(local_10 + 0x80) = local_24;
      *(undefined4 *)(local_10 + 0x188) = 0xffffffff;
      *(undefined4 *)(local_10 + 0x184) = 0xffffffff;
      *(double *)(local_10 + 0xa0) = (double)iVar2 + *(double *)(local_10 + 0xa0);
      *(int *)(local_10 + 100) = *(int *)(local_10 + 100) + 1;
      *(int *)(local_10 + 0x70) = *(int *)(local_10 + 0x70) + 1;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

lu_int lu_update(struct lu *this, double xtbl)
{
    const lu_int m          = this->m;
    const lu_int nforrest   = this->nforrest;
    lu_int Unz              = this->Unz;
    const lu_int pad        = this->pad;
    const double stretch    = this->stretch;
    lu_int *pmap            = this->pmap;
    lu_int *qmap            = this->qmap;
    lu_int *pivotcol        = this->pivotcol;
    lu_int *pivotrow        = this->pivotrow;
    lu_int *Ubegin          = this->Ubegin;
    lu_int *Rbegin          = this->Rbegin;
    lu_int *Wbegin          = this->Wbegin;
    lu_int *Wend            = this->Wend;
    lu_int *Wflink          = this->Wflink;
    lu_int *Wblink          = this->Wblink;
    double *col_pivot       = this->col_pivot;
    double *row_pivot       = this->row_pivot;
    lu_int *Lindex          = this->Lindex;
    double *Lvalue          = this->Lvalue;
    lu_int *Uindex          = this->Uindex;
    double *Uvalue          = this->Uvalue;
    lu_int *Windex          = this->Windex;
    double *Wvalue          = this->Wvalue;
    lu_int *marked          = this->marked;
    lu_int *iwork1          = this->iwork1;
    lu_int *iwork2          = iwork1 + m;
    double *work1           = this->work1;

    lu_int jpivot = this->btran_for_update;
    lu_int ipivot = pmap[jpivot];
    double oldpiv = col_pivot[jpivot];
    lu_int status = BASICLU_OK;

    lu_int i, j, jnext, n, nz, t, put, pos, end, where, room, grow, used,need,M;
    lu_int have_diag, intersect, istriangular, nz_roweta, nz_spike;
    lu_int nreach, *col_reach, *row_reach;
    double spike_diag, newpiv, piverr;

    assert(nforrest < m);

    /*
     * Note: If the singularity test fails or memory is insufficient, then the
     *       update is aborted and the user may call this routine a second time.
     *       Changes made to data structures in the first call must not violate
     *       the logic in the second call.
     */

    /* ------- */
    /* Prepare */
    /* ------- */

    /* if present, move diagonal element to end of spike */
    spike_diag = 0.0;
    have_diag = 0;
    put = Ubegin[m];
    for (pos = put; (i = Uindex[pos]) >= 0; pos++)
    {
        if (i != ipivot)
        {
            Uindex[put] = i;
            Uvalue[put++] = Uvalue[pos];
        }
        else
        {
            spike_diag = Uvalue[pos];
            have_diag = 1;
        }
    }
    if (have_diag)
    {
        Uindex[put] = ipivot;
        Uvalue[put] = spike_diag;
    }
    nz_spike = put - Ubegin[m]; /* nz excluding diagonal */

    nz_roweta = Rbegin[nforrest+1] - Rbegin[nforrest];

    /* ------------- */
    /* Compute pivot */
    /* ------------- */

    /*
     * newpiv is the diagonal element in the spike column after the
     * Forrest-Tomlin update has been applied. It can be computed as
     *
     *    newpiv = spike_diag - dot(spike,row eta)                (1)
     * or
     *    newpiv = xtbl * oldpiv,                                 (2)
     *
     * where spike_diag is the diagonal element in the spike column
     * before the Forrest-Tomlin update and oldpiv was the pivot element
     * in column jpivot before inserting the spike. This routine uses
     * newpiv from (1) and reports the difference to (2) to the user
     * to monitor numerical stability.
     *
     * While computing (1), count intersection of patterns of spike and
     * row eta.
     */

    /* scatter row eta into work1 and mark positions */
    M = ++this->marker;
    for (pos = Rbegin[nforrest]; pos < Rbegin[nforrest+1]; pos++)
    {
        i = Lindex[pos];
        marked[i] = M;
        work1[i] = Lvalue[pos];
    }

    /* compute newpiv and count intersection */
    newpiv = spike_diag;
    intersect = 0;
    for (pos = Ubegin[m]; pos < Ubegin[m] + nz_spike; pos++)
    {
        i = Uindex[pos];
        assert(i != ipivot);
        if (marked[i] == M)
        {
            newpiv -= Uvalue[pos] * work1[i];
            intersect++;
        }
    }

    /* singularity test */
    if (newpiv == 0 || fabs(newpiv) < this->abstol)
    {
        status = BASICLU_ERROR_singular_update;
        return status;
    }

    /* stability measure */
    piverr = fabs(newpiv - xtbl*oldpiv);

    /* ------------ */
    /* Insert spike */
    /* ------------ */

    /* calculate bound on file growth */
    grow = 0;
    for (pos = Ubegin[m]; pos < Ubegin[m] + nz_spike; pos++)
    {
        i = Uindex[pos];
        assert(i != ipivot);
        j = qmap[i];
        jnext = Wflink[j];
        if (Wend[j] == Wbegin[jnext])
        {
            nz = Wend[j] - Wbegin[j];
            grow += nz+1;                 /* row including spike entry */
            grow += stretch*(nz+1) + pad; /* extra room */
        }
    }

    /* reallocate if necessary */
    room = Wend[m] - Wbegin[m];
    if (grow > room)
    {
        this->addmemW = grow-room;
        status = BASICLU_REALLOCATE;
        return status;
    }

    /* remove column jpivot from row file */
    nz = 0;
    for (pos = Ubegin[ipivot]; (i = Uindex[pos]) >= 0; pos++)
    {
        j = qmap[i];
        end = Wend[j]--;
        where = find(jpivot, Windex, Wbegin[j], end);
        assert(where < end);
        Windex[where] = Windex[end-1];
        Wvalue[where] = Wvalue[end-1];
        nz++;
    }
    Unz -= nz;

    /* erase column jpivot in column file */
    for (pos = Ubegin[ipivot]; Uindex[pos] >= 0; pos++)
    {
        Uindex[pos] = GAP;
    }

    /* set column pointers to spike, chop off diagonal */
    Ubegin[ipivot] = Ubegin[m];
    Ubegin[m] += nz_spike;
    Uindex[Ubegin[m]++] = GAP;

    /* insert spike into row file */
    for (pos = Ubegin[ipivot]; (i = Uindex[pos]) >= 0; pos++)
    {
        j = qmap[i];
        jnext = Wflink[j];
        if (Wend[j] == Wbegin[jnext])
        {
            nz = Wend[j] - Wbegin[j];
            room = 1 + stretch*(nz+1) + pad;
            lu_file_reappend(j, m, Wbegin, Wend, Wflink, Wblink, Windex,
                             Wvalue, room);
        }
        end = Wend[j]++;
        Windex[end] = jpivot;
        Wvalue[end] = Uvalue[pos];
    }
    Unz += nz_spike;

    /* insert diagonal */
    col_pivot[jpivot] = spike_diag;
    row_pivot[ipivot] = spike_diag;

    /* ------------------ */
    /* Test triangularity */
    /* ------------------ */

    row_reach = NULL;
    col_reach = NULL;

    if (have_diag)
    {
        /*
         * When the spike has a nonzero diagonal element, then the spiked matrix
         * is (symmetrically) permuted triangular if and only if reach(ipivot)
         * does not intersect with the spike pattern except for ipivot. Since
         * reach(ipivot) \ {ipivot} is the structural pattern of the row eta,
         * the matrix is permuted triangular iff the patterns of the row eta
         * and the spike do not intersect.
         *
         * To update the permutations below, we have to provide reach(ipivot)
         * and the associated column indices in topological order as arrays
         * row_reach[0..nreach-1] and col_reach[0..nreach-1]. Because the
         * pattern of the row eta was computed by a dfs, we obtain row_reach
         * simply by adding ipivot to the front. col_reach can then be obtained
         * through qmap.
         */
        istriangular = intersect == 0;
        if (istriangular)
        {
            this->min_pivot = fmin(this->min_pivot, fabs(newpiv));
            this->max_pivot = fmax(this->max_pivot, fabs(newpiv));

            /* build row_reach and col_reach in topological order */
            nreach = nz_roweta + 1;
            row_reach = iwork1;
            col_reach = iwork2;
            row_reach[0] = ipivot;
            col_reach[0] = jpivot;
            pos = Rbegin[nforrest];
            for (n = 1; n < nreach; n++)
            {
                i = Lindex[pos++];
                row_reach[n] = i;
                col_reach[n] = qmap[i];
            }
            this->nsymperm_total++;
        }
    }
    else
    {
        /*
         * The spike has a zero diagonal element, so the spiked matrix may only
         * be the *un*symmetric permutation of an upper triangular matrix.
         *
         * Part 1:
         *
         * Find an augmenting path in U[pmap,:] starting from jpivot.
         * An augmenting path is a sequence of column indices such that there
         * is an edge from each node to the next, and an edge from the final
         * node back to jpivot.
         *
         * bfs_path computes such a path in path[top..m-1].
         *
         * Because jpivot has no self-edge, the path must have at least two
         * nodes. The path must exist because otherwise the spiked matrix was
         * structurally singular and the singularity test above had failed.
         */
        lu_int *path = iwork1, top;
        lu_int *reach = iwork2, rtop;
        lu_int *pstack = (void *) work1;

        top = bfs_path(m, jpivot, Wbegin, Wend, Windex, path, marked, iwork2);
        assert(top < m-1);
        assert(path[top] == jpivot);

        /*
         * Part 2a:
         *
         * For each path index j (except the final one) mark the nodes in
         * reach(j), where the reach is computed in U[pmap,:] without the path
         * edges. If a path index is contained in the reach of an index that
         * comes before it in the path, then U is not permuted triangular.
         *
         * At the same time assemble the combined reach of all path nodes
         * (except the final one) in U[pmap_new,:], where pmap_new is the
         * column-row mapping after applying the permutation associated with
         * the augmenting path. We only have to replace each index where the
         * dfs starts by the next index in the path. The combined reach is
         * then assembled in topological order in
         *
         *    reach[rtop..m-1].
         */
        istriangular = 1;
        rtop = m;
        M = ++this->marker;
        for (t = top; t < m-1 && istriangular; t++)
        {
            j = path[t];
            jnext = path[t+1];
            where = find(jnext, Windex, Wbegin[j], Wend[j]);
            assert(where < Wend[j]);
            Windex[where] = j;  /* take out for a moment */
            rtop = lu_dfs(j, Wbegin, Wend, Windex, rtop, reach, pstack, marked,
                          M);
            assert(reach[rtop] == j);
            reach[rtop] = jnext;
            Windex[where] = jnext; /* restore */
            istriangular = marked[jnext] != M;
        }

        /*
         * Part 2b:
         *
         * If the matrix looks triangular so far, then also mark the reach of
         * the final path node, which is reach(jpivot) in U[pmap_new,:].
         * U is then permuted triangular iff the combined reach does not
         * intersect the spike pattern except in the final path index.
         */
        if (istriangular)
        {
            j = path[m-1];
            rtop = lu_dfs(j, Wbegin, Wend, Windex, rtop, reach, pstack, marked,
                          M);
            assert(reach[rtop] == j);
            reach[rtop] = jpivot;
            marked[j]--;        /* unmark for a moment */
            for (pos = Ubegin[ipivot]; (i = Uindex[pos]) >= 0; pos++)
            {
                if (marked[qmap[i]] == M) istriangular = 0;
            }
            marked[j]++;        /* restore */
        }

        /*
         * If U is permuted triangular, then permute to zero-free diagonal.
         * Set up row_reach[0..nreach-1] and col_reach[0..nreach-1] for
         * updating the permutations below. The column reach is the combined
         * reach of the path nodes. The row reach is given through pmap.
         */
        if (istriangular)
        {
            lu_int nswap = m-top-1;
            permute(this, path+top, nswap);
            Unz--;
            assert(reach[rtop] == jpivot);
            col_reach = reach + rtop; /* stored in iwork2 */
            row_reach = iwork1 + rtop;
            nreach = m-rtop;
            for (n = 0; n < nreach; n++)
            {
                row_reach[n] = pmap[col_reach[n]];
            }
        }
    }

    /* --------------------- */
    /* Forrest-Tomlin update */
    /* --------------------- */

    if (!istriangular)
    {
        /* remove row ipivot from column file */
        for (pos = Wbegin[jpivot]; pos < Wend[jpivot]; pos++)
        {
            j = Windex[pos];
            assert(j != jpivot);
            where = -1;
            for (end = Ubegin[pmap[j]]; (i = Uindex[end]) >= 0; end++)
            {
                if (i == ipivot) where = end;
            }
            assert(where >= 0);
            Uindex[where] = Uindex[end-1];
            Uvalue[where] = Uvalue[end-1];
            Uindex[end-1] = -1;
            Unz--;
        }

        /* remove row ipivot from row file */
        Wend[jpivot] = Wbegin[jpivot];

        /* replace pivot */
        col_pivot[jpivot] = newpiv;
        row_pivot[ipivot] = newpiv;
        this->min_pivot = fmin(this->min_pivot, fabs(newpiv));
        this->max_pivot = fmax(this->max_pivot, fabs(newpiv));

        /* drop zeros from row eta; update max entry of row etas */
        nz = 0;
        put = Rbegin[nforrest];
        double max_eta = 0;
        for (pos = put; pos < Rbegin[nforrest+1]; pos++)
        {
            if (Lvalue[pos])
            {
                max_eta = fmax(max_eta, fabs(Lvalue[pos]));
                Lindex[put] = Lindex[pos];
                Lvalue[put++] = Lvalue[pos];
                nz++;
            }
        }
        Rbegin[nforrest+1] = put;
        this->Rnz += nz;
        this->max_eta = fmax(this->max_eta, max_eta);

        /* prepare permutation update */
        nreach = 1;
        row_reach = &ipivot;
        col_reach = &jpivot;
        this->nforrest++;
        this->nforrest_total++;
    }

    /* ------------------- */
    /* Update permutations */
    /* ------------------- */

    if (this->pivotlen + nreach > 2*m)
    {
        lu_garbage_perm(this);
    }

    /* append row indices row_reach[0..nreach-1] to end of pivot sequence */
    put = this->pivotlen;
    for (n = 0; n < nreach; n++) pivotrow[put++] = row_reach[n];

    /* append col indices col_reach[0..nreach-1] to end of pivot sequence */
    put = this->pivotlen;
    for (n = 0; n < nreach; n++) pivotcol[put++] = col_reach[n];

    this->pivotlen += nreach;

    /* -------- */
    /* Clean up */
    /* -------- */

    /* compress U if used memory is shrinked sufficiently */
    used = Ubegin[m];
    if (used-Unz-m > this->compress_thres * used)
    {
        nz = compress_packed(m, Ubegin, Uindex, Uvalue);
        assert(nz == Unz);
    }

    /* compress W if used memory is shrinked sufficiently */
    used = Wbegin[m];
    need = Unz + stretch*Unz + m*pad;
    if ((used-need) > this->compress_thres * used)
    {
        nz = lu_file_compress(m, Wbegin, Wend, Wflink, Windex, Wvalue,
                              stretch, pad);
        assert(nz == Unz);
    }

    this->pivot_error = piverr / (1.0 + fabs(newpiv));
    this->Unz = Unz;
    this->btran_for_update = -1;
    this->ftran_for_update = -1;
    this->update_cost_numer += nz_roweta;
    this->nupdate++;
    this->nupdate_total++;

    #ifdef DEBUG_EXTRA
    {
        lu_int col, row;
        check_consistency(this, &col, &row);
        assert(col < 0 && row < 0);
    }
    #endif
    return status;
}